

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Token * generate_token(Lexer *lexer,int chr,CharBuff *buff)

{
  ulong uVar1;
  Token *pTVar2;
  char *kind;
  Kind kind_00;
  KindMeta KVar3;
  
  uVar1 = (ulong)(chr - 0x20U);
  if (chr - 0x20U < 0x3e) {
    if ((0x280000007c00ff62U >> (uVar1 & 0x3f) & 1) != 0) goto LAB_00102830;
    if ((0x84UL >> (uVar1 & 0x3f) & 1) != 0) {
      lexer->last_chr = chr;
      kind = read_string(lexer,buff);
      kind_00 = CONST_STRING;
      goto LAB_0010290a;
    }
    if (uVar1 != 0) goto LAB_0010288e;
LAB_00102870:
    append_chr(buff,(char)chr);
    kind = to_string(buff);
    kind_00 = EMPTY;
  }
  else {
LAB_0010288e:
    if (chr - 0x7bU < 3) {
LAB_00102830:
      lexer->last_chr = chr;
      pTVar2 = read_operator(lexer,buff);
      return pTVar2;
    }
    if (0xfffffff5 < chr - 0x3aU) {
      lexer->last_chr = chr;
      kind = read_digit(lexer,buff);
      kind_00 = NUMBER;
      goto LAB_0010290a;
    }
    if ((-1 < chr) && (0x19 < (chr & 0xffffffdfU) - 0x41)) {
      if ((chr == 10) || (chr == 0xd)) {
        append_chr(buff,(char)chr);
        kind = to_string(buff);
        kind_00 = NEWLINE;
        goto LAB_0010290a;
      }
      if ((chr != 0x5f) && (chr != 0x24)) goto LAB_00102870;
    }
    lexer->last_chr = chr;
    kind = read_letter(lexer,buff);
    KVar3 = find_kind(kind);
    kind_00 = ID;
    if (KVar3.kind != EMPTY) {
      kind_00 = KVar3.kind;
    }
  }
LAB_0010290a:
  pTVar2 = new_token(lexer,kind_00,kind);
  return pTVar2;
}

Assistant:

Token* generate_token(Lexer* lexer, int chr, CharBuff* buff){
    switch (chr) {
        case ' ':
            break;
        case '+':
        case '-':
        case '*':
        case '/':
        case '&':
        case '|':
        case '!':
        case '(':
        case ')':
        case '{':
        case '}':
        case '%':
        case '[':
        case ']':
        case '>':
        case '<':
        case '=':
        case ',':
        case '.':
        case ':':
        case ';':
            unread_chr(lexer, chr);
            return read_operator(lexer, buff);
        case '\'':
        case '"':
            /**
             *  处理字符串
             */
            unread_chr(lexer, chr);
            return new_token(lexer, CONST_STRING, read_string(lexer, buff));
        default: {
            if (is_digit(chr)) {
                unread_chr(lexer, chr);
                return new_token(lexer, NUMBER, read_digit(lexer, buff));
            } else if (is_letter(chr) || is_symbol(chr) || chr < 0) {
                unread_chr(lexer, chr);
                Kind kind;
                char *c = read_letter(lexer, buff);
                if ((kind = find_kind(c).kind) == EMPTY) {
                    kind = ID;
                }
                return new_token(lexer, kind, c);
            } else if (is_new_line(chr)) {
                append_chr(buff, (char) chr);
                return new_token(lexer, NEWLINE, to_string(buff));
            }
        }
    }
    append_chr(buff, (char)chr);
    return new_token(lexer, EMPTY, to_string(buff));
}